

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool __thiscall
wallet::MockableBatch::WriteKey
          (MockableBatch *this,DataStream *key,DataStream *value,bool overwrite)

{
  long lVar1;
  iterator __a;
  iterator __last;
  _Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
  this_00;
  type_conflict2 *ptVar2;
  byte in_CL;
  undefined1 uVar3;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_bool>
  pVar4;
  type_conflict2 *inserted;
  type *it;
  SerializeData value_data;
  SerializeData key_data;
  pair<std::_Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_bool>
  *in_stack_fffffffffffffef8;
  DataStream *in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> *in_stack_ffffffffffffff10;
  allocator_type *in_stack_ffffffffffffff20;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  in_stack_ffffffffffffff40;
  __normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)(in_RDI->super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>)._M_impl
              .super__Vector_impl_data._M_end_of_storage & 1) == 0) {
    bVar5 = 0;
  }
  else {
    DataStream::begin((DataStream *)
                      CONCAT17(in_stack_ffffffffffffff0f,
                               CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)));
    DataStream::end(in_stack_ffffffffffffff00);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::
    vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,void>
              (in_RDI,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff20)
    ;
    __a = DataStream::begin((DataStream *)
                            CONCAT17(in_stack_ffffffffffffff0f,
                                     CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)))
    ;
    __last = DataStream::end(in_stack_ffffffffffffff00);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::
    vector<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,void>
              (in_RDI,in_stack_ffffffffffffff48,
               (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                )__last._M_current,(allocator_type *)__a._M_current);
    pVar4 = std::
            map<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::less<void>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
            ::
            emplace<std::vector<std::byte,zero_after_free_allocator<std::byte>>&,std::vector<std::byte,zero_after_free_allocator<std::byte>>&>
                      ((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                        *)__last._M_current,in_stack_ffffffffffffff10,
                       (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
                       CONCAT17(in_stack_ffffffffffffff0f,
                                CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)));
    this_00 = pVar4.first._M_node;
    uVar3 = pVar4.second;
    std::
    get<0ul,std::_Rb_tree_iterator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>,bool>
              (in_stack_fffffffffffffef8);
    ptVar2 = std::
             get<1ul,std::_Rb_tree_iterator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>,bool>
                       (in_stack_fffffffffffffef8);
    if (((*ptVar2 & 1U) == 0) && ((in_CL & 1) != 0)) {
      std::
      _Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
      ::operator->(&in_stack_fffffffffffffef8->first);
      std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::operator=
                ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)this_00._M_node,
                 (vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      *ptVar2 = true;
    }
    bVar5 = *ptVar2 & 1;
    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::~vector
              ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
               CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)));
    std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::~vector
              ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
               CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar5 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool MockableBatch::WriteKey(DataStream&& key, DataStream&& value, bool overwrite)
{
    if (!m_pass) {
        return false;
    }
    SerializeData key_data{key.begin(), key.end()};
    SerializeData value_data{value.begin(), value.end()};
    auto [it, inserted] = m_records.emplace(key_data, value_data);
    if (!inserted && overwrite) { // Overwrite if requested
        it->second = value_data;
        inserted = true;
    }
    return inserted;
}